

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTestResult.cpp
# Opt level: O0

void __thiscall UnitTest::DeferredTestResult::~DeferredTestResult(DeferredTestResult *this)

{
  DeferredTestResult *this_local;
  
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->failures);
  std::__cxx11::string::~string((string *)&this->failureFile);
  std::__cxx11::string::~string((string *)&this->testName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

DeferredTestResult::~DeferredTestResult()
{
}